

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O0

void Fra_ManPrint(Fra_Man_t *p)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  int local_84;
  int local_68;
  int local_3c;
  double nMemory;
  Fra_Man_t *p_local;
  
  iVar7 = Aig_ManObjNumMax(p->pManAig);
  lVar1 = (long)p->pSml->nWordsTotal * 4 + 0x30;
  auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar8._0_8_ = lVar1;
  auVar8._12_4_ = 0x45300000;
  if (p->nLitsBeg == 0) {
    local_3c = 1;
  }
  else {
    local_3c = p->nLitsBeg;
  }
  printf("SimWord = %d. Round = %d.  Mem = %0.2f MB.  LitBeg = %d.  LitEnd = %d. (%6.2f %%).\n",
         ((double)iVar7 *
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) / 1048576.0,
         ((double)p->nLitsEnd * 100.0) / (double)local_3c,(ulong)(uint)p->pPars->nSimWords,
         (ulong)(uint)p->pSml->nSimRounds,(ulong)(uint)p->nLitsBeg,(ulong)(uint)p->nLitsEnd);
  uVar2 = p->nSatProof;
  uVar3 = p->nSatCallsSat;
  uVar4 = p->nSatFails;
  uVar5 = p->nSatFailsReal;
  uVar6 = p->pPars->nBTLimitNode;
  Fra_ImpComputeStateSpaceRatio(p);
  printf("Proof = %d. Cex = %d. Fail = %d. FailReal = %d. C-lim = %d. ImpRatio = %6.2f %%\n",
         (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
  if (p->nNodesBeg == 0) {
    local_68 = 1;
  }
  else {
    local_68 = p->nNodesBeg;
  }
  if (p->nRegsBeg == 0) {
    local_84 = 1;
  }
  else {
    local_84 = p->nRegsBeg;
  }
  printf("NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
         ((double)(p->nNodesBeg - p->nNodesEnd) * 100.0) / (double)local_68,
         ((double)(p->nRegsBeg - p->nRegsEnd) * 100.0) / (double)local_84,(ulong)(uint)p->nNodesBeg,
         (ulong)(uint)p->nNodesEnd,(ulong)(uint)p->nRegsBeg,(ulong)(uint)p->nRegsEnd);
  if (p->pSat != (sat_solver *)0x0) {
    Sat_SolverPrintStats((FILE *)_stdout,p->pSat);
  }
  if (p->pPars->fUse1Hot != 0) {
    Fra_OneHotEstimateCoverage(p,p->vOneHots);
  }
  Abc_Print(1,"%s =","AIG simulation  ");
  Abc_Print(1,"%9.2f sec\n",((double)p->pSml->timeSim * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","AIG traversal   ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeTrav * 1.0) / 1000000.0);
  if (p->timeRwr != 0) {
    Abc_Print(1,"%s =","AIG rewriting   ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeRwr * 1.0) / 1000000.0);
  }
  Abc_Print(1,"%s =","SAT solving     ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeSat * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","    Unsat       ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeSatUnsat * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","    Sat         ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeSatSat * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","    Fail        ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeSatFail * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Class refining  ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeRef * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","TOTAL RUNTIME   ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeTotal * 1.0) / 1000000.0);
  if (p->time1 != 0) {
    Abc_Print(1,"%s =","time1           ");
    Abc_Print(1,"%9.2f sec\n",((double)p->time1 * 1.0) / 1000000.0);
  }
  if (p->nSpeculs != 0) {
    printf("Speculations = %d.\n",(ulong)(uint)p->nSpeculs);
  }
  fflush(_stdout);
  return;
}

Assistant:

void Fra_ManPrint( Fra_Man_t * p )
{
    double nMemory = 1.0*Aig_ManObjNumMax(p->pManAig)*(p->pSml->nWordsTotal*sizeof(unsigned)+6*sizeof(void*))/(1<<20);
    printf( "SimWord = %d. Round = %d.  Mem = %0.2f MB.  LitBeg = %d.  LitEnd = %d. (%6.2f %%).\n", 
        p->pPars->nSimWords, p->pSml->nSimRounds, nMemory, p->nLitsBeg, p->nLitsEnd, 100.0*p->nLitsEnd/(p->nLitsBeg?p->nLitsBeg:1) );
    printf( "Proof = %d. Cex = %d. Fail = %d. FailReal = %d. C-lim = %d. ImpRatio = %6.2f %%\n", 
        p->nSatProof, p->nSatCallsSat, p->nSatFails, p->nSatFailsReal, p->pPars->nBTLimitNode, Fra_ImpComputeStateSpaceRatio(p) );
    printf( "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
        p->nNodesBeg, p->nNodesEnd, 100.0*(p->nNodesBeg-p->nNodesEnd)/(p->nNodesBeg?p->nNodesBeg:1), 
        p->nRegsBeg, p->nRegsEnd, 100.0*(p->nRegsBeg-p->nRegsEnd)/(p->nRegsBeg?p->nRegsBeg:1) );
    if ( p->pSat )             Sat_SolverPrintStats( stdout, p->pSat );
    if ( p->pPars->fUse1Hot )  Fra_OneHotEstimateCoverage( p, p->vOneHots );
    ABC_PRT( "AIG simulation  ", p->pSml->timeSim  );
    ABC_PRT( "AIG traversal   ", p->timeTrav );
    if ( p->timeRwr )
    {
    ABC_PRT( "AIG rewriting   ", p->timeRwr  );
    }
    ABC_PRT( "SAT solving     ", p->timeSat  );
    ABC_PRT( "    Unsat       ", p->timeSatUnsat );
    ABC_PRT( "    Sat         ", p->timeSatSat   );
    ABC_PRT( "    Fail        ", p->timeSatFail  );
    ABC_PRT( "Class refining  ", p->timeRef   );
    ABC_PRT( "TOTAL RUNTIME   ", p->timeTotal );
    if ( p->time1 ) { ABC_PRT( "time1           ", p->time1 ); }
    if ( p->nSpeculs )
    printf( "Speculations = %d.\n", p->nSpeculs );
    fflush( stdout );
}